

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O3

SharedPtr<Decorator> __thiscall
Rml::DecoratorTextInstancer::InstanceDecorator
          (DecoratorTextInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *param_3)

{
  int iVar1;
  Property *this_00;
  Property *this_01;
  Property *this_02;
  Property *pPVar2;
  Property *extraout_RDX;
  Property *extraout_RDX_00;
  Property *extraout_RDX_01;
  Property *extraout_RDX_02;
  Property *extraout_RDX_03;
  Property *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Property *extraout_RDX_05;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  _Alloc_hider _Var7;
  undefined1 auVar8 [16];
  Array<const_Property_*,_2> p_position;
  SharedPtr<Decorator> SVar9;
  String text;
  undefined1 local_b1;
  uint local_b0;
  Unit local_ac;
  String local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Vector2Numeric local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[9]);
  this_02 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[10]);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[0xb]);
  auVar8._0_4_ = -(uint)((int)((ulong)this_00 >> 0x20) == 0 && (int)this_00 == 0);
  auVar8._4_4_ = -(uint)((int)this_01 == 0 && (int)((ulong)this_01 >> 0x20) == 0);
  auVar8._8_4_ = -(uint)((int)((ulong)this_02 >> 0x20) == 0 && (int)this_02 == 0);
  auVar8._12_4_ = -(uint)((int)pPVar2 == 0 && (int)((ulong)pPVar2 >> 0x20) == 0);
  iVar1 = movmskps((int)pPVar2,auVar8);
  if (iVar1 == 0) {
    Property::Get<std::__cxx11::string>(&local_88,this_00);
    StringUtilities::DecodeRml(&local_a8,&local_88);
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
    }
    if (local_a8._M_string_length == 0) {
      local_88._M_string_length = 0;
      _Var7._M_p = (pointer)(_func_int **)0x0;
    }
    else {
      local_ac = this_01->unit;
      if (local_ac == COLOUR) {
        local_88._M_dataplus._M_p._0_4_ = 0xff000000;
        Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>
                  (&this_01->value,(Colour<unsigned_char,_255,_false> *)&local_88);
        local_b0 = (uint)local_88._M_dataplus._M_p & 0xff;
        uVar5 = (uint)local_88._M_dataplus._M_p & 0xff000000;
        uVar4 = (uint)local_88._M_dataplus._M_p & 0xff0000;
        uVar6 = (uint)local_88._M_dataplus._M_p & 0xff00;
        _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
      }
      else {
        uVar4 = 0;
        uVar5 = 0xff000000;
        uVar6 = 0;
        local_b0 = 0;
      }
      p_position._M_elems[1] = (Property *)_Var3._M_pi;
      p_position._M_elems[0] = pPVar2;
      local_60 = ComputePosition((Rml *)this_02,p_position);
      local_88._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Rml::DecoratorText,std::allocator<Rml::DecoratorText>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length,
                 (DecoratorText **)&local_88,(allocator<Rml::DecoratorText> *)&local_b1);
      _Var7._M_p = local_88._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        local_40._8_8_ = local_a8.field_2._8_8_;
        local_50 = &local_40;
      }
      else {
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_a8._M_dataplus._M_p;
      }
      local_40._M_allocated_capacity._1_7_ = local_a8.field_2._M_allocated_capacity._1_7_;
      local_40._M_local_buf[0] = local_a8.field_2._M_local_buf[0];
      local_48 = local_a8._M_string_length;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      uVar6 = uVar6 | local_b0;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      ::std::__cxx11::string::operator=
                ((string *)(local_88._M_dataplus._M_p + 0x30),(string *)&local_50);
      _Var7._M_p[0x50] = local_ac == KEYWORD;
      *(uint *)(_Var7._M_p + 0x51) = uVar6 | uVar4 | uVar5;
      *(NumericValue *)(_Var7._M_p + 0x58) = local_60.x;
      *(NumericValue *)(_Var7._M_p + 0x60) = local_60.y;
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_03;
      _Var7._M_p = local_88._M_dataplus._M_p;
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40._M_allocated_capacity + 1);
        _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_04;
        _Var7._M_p = local_88._M_dataplus._M_p;
      }
    }
    (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)_Var7._M_p;
    (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_05;
    }
  }
  else {
    (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  }
  SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTextInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& /*instancer_interface*/)
{
	const Property* p_text = properties.GetProperty(ids.text);
	const Property* p_color = properties.GetProperty(ids.color);
	Array<const Property*, 2> p_align = {properties.GetProperty(ids.align_x), properties.GetProperty(ids.align_y)};
	if (!p_text || !p_color || !p_align[0] || !p_align[1])
		return nullptr;

	String text = StringUtilities::DecodeRml(p_text->Get<String>());
	if (text.empty())
		return nullptr;

	const bool inherit_color = (p_color->unit == Unit::KEYWORD);
	const Colourb color = (p_color->unit == Unit::COLOUR ? p_color->Get<Colourb>() : Colourb{});
	const Vector2Numeric align = ComputePosition(p_align);

	auto decorator = MakeShared<DecoratorText>();
	decorator->Initialise(std::move(text), inherit_color, color, align);
	return decorator;
}